

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# name_cache_test.cpp
# Opt level: O0

void __thiscall
bidfx_public_api::tools::NameCacheTests_test_get_default_Test::TestBody
          (NameCacheTests_test_get_default_Test *this)

{
  bool bVar1;
  NameCache *pNVar2;
  char *message;
  AssertHelper local_60;
  Message local_58 [3];
  NameCache *local_40;
  NameCache *local_38;
  undefined1 local_30 [8];
  AssertionResult gtest_ar;
  NameCache *cache2;
  NameCache *cache1;
  NameCacheTests_test_get_default_Test *this_local;
  
  pNVar2 = (NameCache *)bidfx_public_api::tools::NameCache::GetDefault();
  local_40 = (NameCache *)bidfx_public_api::tools::NameCache::GetDefault();
  local_38 = pNVar2;
  gtest_ar.message_.ptr_ =
       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_40;
  testing::internal::EqHelper<false>::
  Compare<bidfx_public_api::tools::NameCache*,bidfx_public_api::tools::NameCache*>
            ((EqHelper<false> *)local_30,"&cache1","&cache2",&local_38,&local_40);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_30);
  if (!bVar1) {
    testing::Message::Message(local_58);
    message = testing::AssertionResult::failure_message((AssertionResult *)local_30);
    testing::internal::AssertHelper::AssertHelper
              (&local_60,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/bidfx[P]bidfx-api-cpp/test/tools/name_cache_test.cpp"
               ,0x34,message);
    testing::internal::AssertHelper::operator=(&local_60,local_58);
    testing::internal::AssertHelper::~AssertHelper(&local_60);
    testing::Message::~Message(local_58);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_30);
  return;
}

Assistant:

TEST_F(NameCacheTests, test_get_default)
{
    NameCache& cache1 = NameCache::GetDefault();
    NameCache& cache2 = NameCache::GetDefault();
    EXPECT_EQ(&cache1, &cache2);
}